

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCPUWarmup.cpp
# Opt level: O3

void tcu::warmupCPU(void)

{
  int i_2;
  uint uVar1;
  deUint64 dVar2;
  deUint64 dVar3;
  int iVar4;
  int iVar5;
  int i_1;
  uint uVar7;
  int i;
  long lVar8;
  int i_3;
  int iVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  deInt64 times [3];
  float absoluteDeviations [5];
  float local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  float fStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined1 local_80 [8];
  uint local_78 [2];
  float fStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  uint local_48 [2];
  float fStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  int iVar6;
  
  local_b0 = *warmupCPUInternal::g_dummy;
  uVar7 = 1;
  do {
    uVar1 = uVar7;
    if (0x3fffffff < uVar1) break;
    lVar8 = 0;
    do {
      iVar5 = 0x7b;
      uVar7 = 0;
      dVar2 = deGetMicroseconds();
      do {
        iVar9 = 4;
        do {
          local_b0 = cosf((float)iVar5 + local_b0);
          iVar4 = (int)(local_b0 * 10.0);
          iVar6 = -iVar4;
          if (0 < iVar4) {
            iVar6 = iVar4;
          }
          iVar5 = iVar6 + ((iVar5 + 0x3f) / 0x6b) * -0x6b + iVar5 + 0x3f;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar1);
      local_b0 = local_b0 + (float)iVar5;
      dVar3 = deGetMicroseconds();
      *(deUint64 *)(local_78 + lVar8 * 2) = dVar3 - dVar2;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    local_98 = CONCAT44(uStack_64,local_68);
    local_a8 = local_78[0];
    uStack_a4 = local_78[1];
    fStack_a0 = fStack_70;
    uStack_9c = uStack_6c;
    std::__insertion_sort<long*,__gnu_cxx::__ops::_Iter_less_iter>(&local_a8,&uStack_90);
    uVar7 = uVar1 * 2;
  } while (CONCAT44(uStack_9c,fStack_a0) < 10000);
  uVar7 = 0;
  do {
    if (4 < uVar7) {
      local_88 = local_58;
      local_98 = CONCAT44(uStack_64,local_68);
      uStack_90 = uStack_60;
      uStack_8c = uStack_5c;
      local_a8 = local_78[0];
      uStack_a4 = local_78[1];
      fStack_a0 = fStack_70;
      uStack_9c = uStack_6c;
      std::__insertion_sort<long*,__gnu_cxx::__ops::_Iter_less_iter>(&local_a8,local_80);
      fVar12 = (float)local_98;
      lVar8 = 0;
      do {
        fVar11 = (float)*(long *)(local_78 + lVar8 * 2) - fVar12;
        uVar10 = -(uint)(-fVar11 <= fVar11);
        local_48[lVar8] = ~uVar10 & (uint)-fVar11 | (uint)fVar11 & uVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      local_98 = CONCAT44(local_98._4_4_,local_38);
      local_a8 = local_48[0];
      uStack_a4 = local_48[1];
      fStack_a0 = fStack_40;
      uStack_9c = uStack_3c;
      std::__insertion_sort<float*,__gnu_cxx::__ops::_Iter_less_iter>(&local_a8,(long)&local_98 + 4)
      ;
      if (fStack_a0 / fVar12 <= 0.05) break;
    }
    iVar5 = 0x7b;
    uVar10 = 0;
    dVar2 = deGetMicroseconds();
    do {
      iVar9 = 4;
      do {
        local_b0 = cosf((float)iVar5 + local_b0);
        iVar4 = (int)(local_b0 * 10.0);
        iVar6 = -iVar4;
        if (0 < iVar4) {
          iVar6 = iVar4;
        }
        iVar5 = iVar6 + ((iVar5 + 0x3f) / 0x6b) * -0x6b + iVar5 + 0x3f;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar1);
    local_b0 = local_b0 + (float)iVar5;
    dVar3 = deGetMicroseconds();
    *(deUint64 *)(local_78 + (ulong)(uVar7 % 5) * 2) = dVar3 - dVar2;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x32);
  *warmupCPUInternal::g_dummy = local_b0;
  return;
}

Assistant:

void warmupCPU (void)
{
	float	dummy				= *warmupCPUInternal::g_dummy.m_v;
	int		computationSize		= 1;

	// Do a rough calibration for computationSize to get dummyComputation's running time above a certain threshold.
	while (computationSize < 1<<30) // \note This condition is unlikely to be met. The "real" loop exit is the break below.
	{
		const float		singleMeasurementThreshold	= 10000.0f;
		const int		numMeasurements				= 3;
		deInt64			times[numMeasurements];

		for (int i = 0; i < numMeasurements; i++)
		{
			const deUint64 startTime = deGetMicroseconds();
			dummy = dummyComputation(dummy, computationSize);
			times[i] = (deInt64)(deGetMicroseconds() - startTime);
		}

		if (floatMedian(times) >= singleMeasurementThreshold)
			break;

		computationSize *= 2;
	}

	// Do dummyComputations until running time seems stable enough.
	{
		const int			maxNumMeasurements							= 50;
		const int			numConsecutiveMeasurementsRequired			= 5;
		const float			relativeMedianAbsoluteDeviationThreshold	= 0.05f;
		deInt64				latestTimes[numConsecutiveMeasurementsRequired];

		for (int measurementNdx = 0;

			 measurementNdx < maxNumMeasurements &&
			 (measurementNdx < numConsecutiveMeasurementsRequired ||
			  floatRelativeMedianAbsoluteDeviation(latestTimes) > relativeMedianAbsoluteDeviationThreshold);

			 measurementNdx++)
		{
			const deUint64 startTime = deGetMicroseconds();
			dummy = dummyComputation(dummy, computationSize);
			latestTimes[measurementNdx % numConsecutiveMeasurementsRequired] = (deInt64)(deGetMicroseconds() - startTime);
		}
	}

	*warmupCPUInternal::g_dummy.m_v = dummy;
}